

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline_int8_x86(InnerProduct_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  float fVar1;
  uint _h;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  int *piVar4;
  size_t _elemsize;
  byte bVar5;
  void *pvVar6;
  ulong uVar7;
  int j;
  size_t sVar8;
  int p_1;
  int _elempack;
  long lVar9;
  ulong uVar10;
  int _w;
  ulong uVar11;
  float fVar12;
  Mat local_78;
  
  this_00 = (Mat *)(&this->field_0x130 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
  _h = this_00[-2].h;
  uVar11 = (long)this_00[-2].c / (long)(int)_h;
  bVar5 = (_h & 7) == 0 & opt->use_packing_layout;
  _elemsize = 1;
  if (bVar5 != 0) {
    _elemsize = 8;
  }
  uVar10 = 0;
  _w = (int)uVar11;
  Mat::reshape(&local_78,this_00,_w,_h,(Allocator *)0x0);
  _elempack = (int)_elemsize;
  Mat::create(&this->weight_data_tm,_w,
              *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
              _elempack,_elemsize,_elempack,(Allocator *)0x0);
  pp_Var2 = this->_vptr_InnerProduct_x86_avx512;
  uVar11 = uVar11 & 0xffffffff;
  if (_w < 1) {
    uVar11 = uVar10;
  }
  for (; (long)((_elempack - 1) + uVar10) < (long)*(int *)(&this->field_0xd0 + (long)pp_Var2[-3]);
      uVar10 = uVar10 + _elemsize) {
    pvVar6 = (void *)((ulong)((uint)uVar10 >> bVar5 * '\x03') * (long)(this->weight_data_tm).w *
                      (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
    for (uVar7 = 0; uVar7 != uVar11; uVar7 = uVar7 + 1) {
      for (sVar8 = 0; _elemsize != sVar8; sVar8 = sVar8 + 1) {
        *(undefined1 *)((long)pvVar6 + sVar8) =
             *(undefined1 *)
              ((long)local_78.data + uVar7 + (long)local_78.w * (sVar8 + uVar10) * local_78.elemsize
              );
      }
      pvVar6 = (void *)((long)pvVar6 + sVar8);
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  lVar9 = 0;
  Mat::create(&this->scale_in_data,
              *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]),4,
              (Allocator *)0x0);
  pp_Var2 = this->_vptr_InnerProduct_x86_avx512;
  pvVar6 = (this->scale_in_data).data;
  while( true ) {
    p_Var3 = pp_Var2[-3];
    if (*(int *)(&this->field_0xd0 + (long)p_Var3) <= lVar9) break;
    fVar1 = *(float *)(*(long *)(&this->field_0x1c0 + (long)p_Var3) + lVar9 * 4);
    fVar12 = 0.0;
    if (fVar1 != 0.0) {
      fVar12 = 1.0 / (fVar1 * **(float **)(&this->field_0x208 + (long)p_Var3));
    }
    *(float *)((long)pvVar6 + lVar9 * 4) = fVar12;
    lVar9 = lVar9 + 1;
  }
  if (opt->lightmode != false) {
    piVar4 = *(int **)(&this->field_0x138 + (long)p_Var3);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (*(long **)(&this->field_0x150 + (long)p_Var3) == (long *)0x0) {
          free(*(void **)(&this->field_0x130 + (long)p_Var3));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var3) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x170 + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x144 + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x138 + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var3) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var3) = 0;
    *(undefined4 *)(&this->field_0x168 + (long)p_Var3) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline_int8_x86(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__

    // src = inch-outch
    // dst = pb-inch-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_tm.create(num_input, num_output / out_elempack, (size_t)out_elempack, out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            signed char* g0 = weight_data_tm.row<signed char>(q / out_elempack);

            for (int p = 0; p < num_input; p++)
            {
                for (int j = 0; j < out_elempack; j++)
                {
                    *g0++ = weight_data_r2.row<signed char>(q + j)[p];
                }
            }
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // dequantize
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}